

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O2

value value_type_copy(value v)

{
  type_id id;
  int iVar1;
  value pvVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  value pvVar6;
  function func;
  klass cls;
  object obj;
  exception ex;
  size_t sVar7;
  
  if (v != (value)0x0) {
    id = value_type_id(v);
    iVar1 = type_id_array(id);
    if (iVar1 == 0) {
      sVar3 = value_type_count(v);
      pvVar2 = value_create_array((value *)0x0,sVar3);
      pvVar4 = value_data(pvVar2);
      pvVar5 = value_data(v);
      for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
        pvVar6 = value_type_copy(*(value *)((long)pvVar5 + sVar7 * 8));
        *(value *)((long)pvVar4 + sVar7 * 8) = pvVar6;
      }
      return pvVar2;
    }
    iVar1 = type_id_map(id);
    if (iVar1 == 0) {
      sVar3 = value_type_count(v);
      pvVar2 = value_create_map((value *)0x0,sVar3);
      pvVar4 = value_data(pvVar2);
      pvVar5 = value_data(v);
      for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
        pvVar6 = value_type_copy(*(value *)((long)pvVar5 + sVar7 * 8));
        *(value *)((long)pvVar4 + sVar7 * 8) = pvVar6;
      }
      return pvVar2;
    }
    iVar1 = type_id_function(id);
    if (iVar1 == 0) {
      pvVar2 = value_copy(v);
      if (pvVar2 != (value)0x0) {
        func = value_to_function(pvVar2);
        function_increment_reference(func);
        return pvVar2;
      }
    }
    else {
      iVar1 = type_id_class(id);
      if (iVar1 == 0) {
        pvVar2 = value_copy(v);
        if (pvVar2 != (value)0x0) {
          cls = value_to_class(v);
          class_increment_reference(cls);
          return pvVar2;
        }
      }
      else {
        iVar1 = type_id_object(id);
        if (iVar1 == 0) {
          pvVar2 = value_copy(v);
          if (pvVar2 != (value)0x0) {
            obj = value_to_object(pvVar2);
            object_increment_reference(obj);
            return pvVar2;
          }
        }
        else {
          iVar1 = type_id_exception(id);
          if (iVar1 == 0) {
            pvVar2 = value_copy(v);
            if (pvVar2 != (value)0x0) {
              ex = value_to_exception(pvVar2);
              exception_increment_reference(ex);
              return pvVar2;
            }
          }
          else {
            iVar1 = type_id_throwable(id);
            if (iVar1 == 0) {
              pvVar2 = value_create_throwable((throwable)v);
              return pvVar2;
            }
            iVar1 = type_id_invalid(id);
            if (iVar1 != 0) {
              pvVar2 = value_copy(v);
              return pvVar2;
            }
          }
        }
      }
    }
  }
  return (value)0x0;
}

Assistant:

value value_type_copy(value v)
{
	if (v != NULL)
	{
		type_id id = value_type_id(v);

		if (type_id_array(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value new_v = value_create_array(NULL, size);

			value *new_v_array = value_to_array(new_v);

			value *v_array = value_to_array(v);

			for (index = 0; index < size; ++index)
			{
				new_v_array[index] = value_type_copy(v_array[index]);
			}

			return new_v;
		}
		else if (type_id_map(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value new_v = value_create_map(NULL, size);

			value *new_v_map = value_to_map(new_v);

			value *v_map = value_to_map(v);

			for (index = 0; index < size; ++index)
			{
				new_v_map[index] = value_type_copy(v_map[index]);
			}

			return new_v;
		}
		else if (type_id_function(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				function f = value_to_function(cpy);

				function_increment_reference(f);
			}

			return cpy;
		}
		else if (type_id_class(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				klass cls = value_to_class(v);

				class_increment_reference(cls);
			}

			return cpy;
		}
		else if (type_id_object(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				object obj = value_to_object(cpy);

				object_increment_reference(obj);
			}

			return cpy;
		}
		else if (type_id_exception(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				exception ex = value_to_exception(cpy);

				exception_increment_reference(ex);
			}

			return cpy;
		}
		else if (type_id_throwable(id) == 0)
		{
			/* Just create a new throwable from the previous one, it will get flattened after creation */
			return value_create_throwable(v);
		}

		if (type_id_invalid(id) != 0)
		{
			return value_copy(v);
		}
	}

	return NULL;
}